

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O2

int64_t hdr_interval_recorder_record_corrected_values_atomic
                  (hdr_interval_recorder *r,int64_t value,int64_t count,int64_t expected_interval)

{
  int64_t params [4];
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  int64_t local_10;
  
  local_10 = 0;
  local_28 = value;
  local_20 = count;
  local_18 = expected_interval;
  hdr_interval_recorder_update(r,update_corrected_values_atomic,&local_28);
  return local_10;
}

Assistant:

int64_t hdr_interval_recorder_record_corrected_values_atomic(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count,
    int64_t expected_interval
)
{
    int64_t params[4];
    params[0] = value;
    params[1] = count;
    params[2] = expected_interval;
    params[3] = 0;

    hdr_interval_recorder_update(r, update_corrected_values_atomic, &params[0]);
    return params[3];
}